

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

qint64 __thiscall QProcessPrivate::bytesAvailableInChannel(QProcessPrivate *this,Channel *channel)

{
  int iVar1;
  long in_RSI;
  long in_FS_OFFSET;
  qint64 available;
  int nbytes;
  long local_28;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  local_28 = 0;
  iVar1 = ioctl(*(int *)(in_RSI + 0x28),0x541b,&local_c);
  if (-1 < iVar1) {
    local_28 = (long)local_c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QProcessPrivate::bytesAvailableInChannel(const Channel *channel) const
{
    Q_ASSERT(channel->pipe[0] != INVALID_Q_PIPE);
    int nbytes = 0;
    qint64 available = 0;
    if (::ioctl(channel->pipe[0], FIONREAD, (char *) &nbytes) >= 0)
        available = (qint64) nbytes;
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::bytesAvailableInChannel(%d) == %lld", int(channel - &stdinChannel), available);
#endif
    return available;
}